

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

uniformDMatFunctionPointer __thiscall
gl4cts::GPUShaderFP64Test10::getUniformFunctionForDMat
          (GPUShaderFP64Test10 *this,GLuint argument,functionObject *function_object)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  Functions *gl;
  _variable_type argument_type;
  functionObject *function_object_local;
  GLuint argument_local;
  GPUShaderFP64Test10 *this_local;
  long lVar4;
  
  iVar1 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  switch(iVar1) {
  case 5:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x15d8);
    break;
  case 6:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x15e8);
    break;
  case 7:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x15f8);
    break;
  case 8:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1608);
    break;
  case 9:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1618);
    break;
  case 10:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1628);
    break;
  case 0xb:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1638);
    break;
  case 0xc:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1648);
    break;
  case 0xd:
    this_local = *(GPUShaderFP64Test10 **)(lVar4 + 0x1658);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not implemented",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x3844);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (uniformDMatFunctionPointer)this_local;
}

Assistant:

GPUShaderFP64Test10::uniformDMatFunctionPointer GPUShaderFP64Test10::getUniformFunctionForDMat(
	glw::GLuint argument, const functionObject& function_object) const
{
	const Utils::_variable_type argument_type = function_object.getArgumentType(argument);
	const glw::Functions&		gl			  = m_context.getRenderContext().getFunctions();

	switch (argument_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
		return gl.uniformMatrix2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT2X3:
		return gl.uniformMatrix2x3dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT2X4:
		return gl.uniformMatrix2x4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3:
		return gl.uniformMatrix3dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3X2:
		return gl.uniformMatrix3x2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT3X4:
		return gl.uniformMatrix3x4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4:
		return gl.uniformMatrix4dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4X2:
		return gl.uniformMatrix4x2dv;
		break;
	case Utils::VARIABLE_TYPE_DMAT4X3:
		return gl.uniformMatrix4x3dv;
		break;
	default:
		break;
	}

	TCU_FAIL("Not implemented");
	return 0;
}